

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

char * __thiscall Json::Value::asCString(Value *this)

{
  char *pcVar1;
  ostringstream oss;
  string local_1a0;
  ostringstream local_180 [376];
  
  if ((char)*(ushort *)&this->field_0x8 == '\x04') {
    pcVar1 = (this->value_).string_ + (*(ushort *)&this->field_0x8 >> 6 & 4);
    if ((this->value_).string_ == (char *)0x0) {
      pcVar1 = (char *)0x0;
    }
    return pcVar1;
  }
  std::__cxx11::ostringstream::ostringstream(local_180);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_180,"in Json::Value::asCString(): requires stringValue",0x31);
  std::__cxx11::stringbuf::str();
  throwLogicError(&local_1a0);
}

Assistant:

const char* Value::asCString() const {
  JSON_ASSERT_MESSAGE(type_ == stringValue,
                      "in Json::Value::asCString(): requires stringValue");
  if (value_.string_ == 0) return 0;
  unsigned this_len;
  char const* this_str;
  decodePrefixedString(this->allocated_, this->value_.string_, &this_len, &this_str);
  return this_str;
}